

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreCommands.cpp
# Opt level: O1

void __thiscall
HelpIRCCommand::trigger
          (HelpIRCCommand *this,IRC_Bot *source,string_view in_channel,string_view nick,
          string_view parameters)

{
  int iVar1;
  int iVar2;
  long lVar3;
  Channel *pCVar4;
  uint uVar5;
  ulong uVar6;
  size_t sVar7;
  char *pcVar8;
  char *in_whitespace_end;
  undefined1 auVar9 [16];
  vector<IRCCommand_*,_std::allocator<IRCCommand_*>_> cmds;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  local_88;
  void *local_68;
  void *local_60;
  long local_58;
  string local_50;
  
  pcVar8 = nick._M_str;
  sVar7 = nick._M_len;
  in_whitespace_end = pcVar8;
  lVar3 = Jupiter::IRC::Client::getChannel(source,in_channel._M_len,in_channel._M_str);
  if (lVar3 != 0) {
    iVar1 = Jupiter::IRC::Client::getAccessLevel(source,lVar3,sVar7,pcVar8);
    if (parameters._M_len == 0) {
      if (-1 < iVar1) {
        uVar6 = 0;
        do {
          IRC_Bot::getAccessCommands((Channel *)&local_68,(int)source);
          if (local_60 != local_68) {
            IRC_Bot::getTriggers_abi_cxx11_((vector *)&local_88);
            string_printf_abi_cxx11_
                      (&local_50,"Access level %d commands: %.*s",uVar6,local_88.first._M_str,
                       local_88.first._M_len);
            Jupiter::IRC::Client::sendNotice
                      (source,sVar7,pcVar8,local_50._M_string_length,local_50._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p != &local_50.field_2) {
              operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
            }
            if ((basic_string_view<char,_std::char_traits<char>_> *)local_88.first._M_len !=
                &local_88.second) {
              operator_delete((void *)local_88.first._M_len,local_88.second._M_len + 1);
            }
          }
          if (local_68 != (void *)0x0) {
            operator_delete(local_68,local_58 - (long)local_68);
          }
          uVar5 = (int)uVar6 + 1;
          uVar6 = (ulong)uVar5;
        } while (iVar1 + 1U != uVar5);
      }
      auVar9._8_8_ = "For command-specific help, use: help <command>";
      auVar9._0_8_ = 0x2e;
    }
    else {
      jessilib::
      word_split_once<std::basic_string_view<char,std::char_traits<char>>,char_const*,char_const*,char_const*,char_const*>
                (&local_88,(jessilib *)parameters._M_str,parameters._M_str + parameters._M_len," \t"
                 ,"",in_whitespace_end);
      pCVar4 = (Channel *)IRC_Bot::getCommand(source,local_88.first._M_len,local_88.first._M_str);
      if (pCVar4 == (Channel *)0x0) {
        auVar9._8_8_ = "Error: Command not found.";
        auVar9._0_8_ = 0x19;
      }
      else {
        iVar2 = IRCCommand::getAccessLevel(pCVar4);
        if (iVar2 < 0) {
          auVar9._8_8_ = "Error: Command disabled.";
          auVar9._0_8_ = 0x18;
        }
        else if (iVar1 < iVar2) {
          auVar9._8_8_ = "Access Denied.";
          auVar9._0_8_ = 0xe;
        }
        else {
          auVar9 = (*(code *)**(undefined8 **)pCVar4)
                             (pCVar4,local_88.second._M_len,local_88.second._M_str);
        }
      }
    }
    Jupiter::IRC::Client::sendNotice(source,sVar7,pcVar8,auVar9._0_8_,auVar9._8_8_);
  }
  return;
}

Assistant:

void HelpIRCCommand::trigger(IRC_Bot *source, std::string_view in_channel, std::string_view nick, std::string_view parameters) {
	Jupiter::IRC::Client::Channel *channel = source->getChannel(in_channel);
	if (channel != nullptr)
	{
		int access = source->getAccessLevel(*channel, nick);
		if (parameters.empty()) {
			for (int i = 0; i <= access; i++) {
				auto cmds = source->getAccessCommands(channel, i);
				if (cmds.size() != 0) {
					std::string triggers = source->getTriggers(cmds);
					if (triggers.size() >= 0) {
						source->sendNotice(nick, string_printf("Access level %d commands: %.*s", i, triggers.size(),
							triggers.data()));
					}
				}
			}
			source->sendNotice(nick, "For command-specific help, use: help <command>"sv);
		}
		else {
			auto command_split = jessilib::word_split_once_view(std::string_view{parameters}, WHITESPACE_SV);
			IRCCommand *cmd = source->getCommand(command_split.first);
			if (cmd) {
				int command_access = cmd->getAccessLevel(channel);

				if (command_access < 0)
					source->sendNotice(nick, "Error: Command disabled."sv);
				else if (access < command_access)
					source->sendNotice(nick, "Access Denied."sv);
				else
					source->sendNotice(nick, cmd->getHelp(command_split.second));
			}
			else source->sendNotice(nick, "Error: Command not found."sv);
		}
	}
}